

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_assert.cc
# Opt level: O3

void lf::base::AssertionFailed(string *expr,string *file,long line,string *msg)

{
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  basic_stacktrace<std::allocator<boost::stacktrace::frame>_> local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"***** Internal Program Error - assertion (",0x2a);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(expr->_M_dataplus)._M_p,expr->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") failed:\n",10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(file->_M_dataplus)._M_p,file->_M_string_length);
  local_48.impl_.
  super__Vector_base<boost::stacktrace::frame,_std::allocator<boost::stacktrace::frame>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_48.impl_.
                         super__Vector_base<boost::stacktrace::frame,_std::allocator<boost::stacktrace::frame>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,0x28);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_48,1);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"): ",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(msg->_M_dataplus)._M_p,msg->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Backtrace:\n",0xb);
  local_48.impl_.
  super__Vector_base<boost::stacktrace::frame,_std::allocator<boost::stacktrace::frame>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.impl_.
  super__Vector_base<boost::stacktrace::frame,_std::allocator<boost::stacktrace::frame>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.impl_.
  super__Vector_base<boost::stacktrace::frame,_std::allocator<boost::stacktrace::frame>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::stacktrace::basic_stacktrace<std::allocator<boost::stacktrace::frame>_>::init
            (&local_48,(EVP_PKEY_CTX *)0x0);
  pbVar2 = boost::stacktrace::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,&local_48);
  std::operator<<(pbVar2,'\n');
  boost::stacktrace::basic_stacktrace<std::allocator<boost::stacktrace::frame>_>::~basic_stacktrace
            (&local_48);
  abort();
}

Assistant:

void AssertionFailed(const std::string& expr, const std::string& file,
                     long line, const std::string& msg) {
  std::cerr << "***** Internal Program Error - assertion (" << expr
            << ") failed:\n"
            << file << '(' << line << "): " << msg << std::endl;  // NOLINT
  std::cerr << "Backtrace:\n" << boost::stacktrace::stacktrace() << '\n';
  std::abort();
}